

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::checkExplanation(SAT *this,Clause *c,int clevel,int index)

{
  fprintf(_stderr,"%s:%d: ","conflict.cpp",0x287);
  fwrite("Not yet supported\n",0x12,1,_stderr);
  abort();
}

Assistant:

void SAT::checkExplanation(Clause& c, int clevel, int index) {
	NOT_SUPPORTED;
	for (unsigned int i = 1; i < c.size(); i++) {
		assert(value(c[i]) == l_False);
		assert(trailpos[var(c[i])] < engine.trail_lim[clevel]);
		vec<Lit>& ctrail = trail[trailpos[var(c[i])]];
		int pos = -1;
		for (unsigned int j = 0; j < ctrail.size(); j++) {
			if (var(ctrail[j]) == var(c[i])) {
				pos = j;
				if (trailpos[var(c[i])] == clevel) {
					assert(static_cast<int>(j) <= index);
				}
				break;
			}
		}
		assert(pos != -1);
	}
}